

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_stat(archive_match *a,wchar_t timetype,stat_conflict1 *st)

{
  archive_entry *entry;
  time_t ctime_sec_00;
  long ctime_nsec;
  time_t mtime_sec_00;
  long mtime_nsec;
  long mtime_ns;
  long ctime_ns;
  time_t mtime_sec;
  time_t ctime_sec;
  archive_entry *ae;
  stat_conflict1 *st_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  entry = archive_entry_new();
  if (entry == (archive_entry *)0x0) {
    a_local._4_4_ = error_nomem(a);
  }
  else {
    archive_entry_copy_stat(entry,(stat *)st);
    ctime_sec_00 = archive_entry_ctime(entry);
    ctime_nsec = archive_entry_ctime_nsec(entry);
    mtime_sec_00 = archive_entry_mtime(entry);
    mtime_nsec = archive_entry_mtime_nsec(entry);
    archive_entry_free(entry);
    a_local._4_4_ = set_timefilter(a,timetype,mtime_sec_00,mtime_nsec,ctime_sec_00,ctime_nsec);
  }
  return a_local._4_4_;
}

Assistant:

static int
set_timefilter_stat(struct archive_match *a, int timetype, struct stat *st)
{
	struct archive_entry *ae;
	time_t ctime_sec, mtime_sec;
	long ctime_ns, mtime_ns;

	ae = archive_entry_new();
	if (ae == NULL)
		return (error_nomem(a));
	archive_entry_copy_stat(ae, st);
	ctime_sec = archive_entry_ctime(ae);
	ctime_ns = archive_entry_ctime_nsec(ae);
	mtime_sec = archive_entry_mtime(ae);
	mtime_ns = archive_entry_mtime_nsec(ae);
	archive_entry_free(ae);
	return set_timefilter(a, timetype, mtime_sec, mtime_ns,
			ctime_sec, ctime_ns);
}